

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O0

void __thiscall
QFileDialogListView::setFileDialogPrivate(QFileDialogListView *this,QFileDialogPrivate *d_pointer)

{
  long lVar1;
  undefined8 in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  ResizeMode in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  QWidget *pQVar3;
  DragDropMode behavior;
  QAbstractItemView *in_stack_fffffffffffffff0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)(in_RDI + 1) = in_RSI;
  uVar2 = 1;
  pQVar3 = in_RDI;
  QAbstractItemView::setSelectionBehavior
            ((QAbstractItemView *)CONCAT44(1,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  behavior = (DragDropMode)((ulong)pQVar3 >> 0x20);
  QListView::setWrapping
            ((QListView *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
             SUB41(in_stack_ffffffffffffffcc >> 0x18,0));
  QListView::setResizeMode
            ((QListView *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),in_stack_ffffffffffffffcc);
  QFlags<QAbstractItemView::EditTrigger>::QFlags
            ((QFlags<QAbstractItemView::EditTrigger> *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffcc);
  QAbstractItemView::setEditTriggers
            ((QAbstractItemView *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
             (QFlagsStorageHelper<QAbstractItemView::EditTrigger,_4>)SUB84((ulong)in_RDI >> 0x20,0))
  ;
  QWidget::setContextMenuPolicy(in_RDI,CustomContextMenu);
  QAbstractItemView::setDragDropMode(in_stack_fffffffffffffff0,behavior);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogListView::setFileDialogPrivate(QFileDialogPrivate *d_pointer)
{
    d_ptr = d_pointer;
    setSelectionBehavior(QAbstractItemView::SelectRows);
    setWrapping(true);
    setResizeMode(QListView::Adjust);
    setEditTriggers(QAbstractItemView::EditKeyPressed);
    setContextMenuPolicy(Qt::CustomContextMenu);
#if QT_CONFIG(draganddrop)
    setDragDropMode(QAbstractItemView::InternalMove);
#endif
}